

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.cpp
# Opt level: O0

cali_attr_type __thiscall cali::Attribute::type(Attribute *this)

{
  cali_attr_type cVar1;
  cali_id_t cVar2;
  cali_variant_t local_30;
  Node *local_20;
  Node *node;
  Attribute *this_local;
  
  local_20 = this->m_node;
  node = (Node *)this;
  while( true ) {
    if (local_20 == (Node *)0x0) {
      return CALI_TYPE_INV;
    }
    cVar2 = Node::attribute(local_20);
    if (cVar2 == 9) break;
    local_20 = util::LockfreeIntrusiveTree<cali::Node>::parent
                         (&local_20->super_LockfreeIntrusiveTree<cali::Node>);
  }
  local_30 = (cali_variant_t)Node::data(local_20);
  cVar1 = Variant::to_attr_type((Variant *)&local_30,(bool *)0x0);
  return cVar1;
}

Assistant:

cali_attr_type Attribute::type() const
{
    for (const Node* node = m_node; node; node = node->parent())
        if (node->attribute() == TYPE_ATTR_ID)
            return node->data().to_attr_type();

    return CALI_TYPE_INV;
}